

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

_Bool expand_vec_cmp_noinv
                (TCGContext_conflict9 *tcg_ctx,TCGType_conflict type,uint vece,TCGv_vec v0,
                TCGv_vec v1,TCGv_vec v2,TCGCond cond)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  TCGArg r;
  TCGArg a;
  TCGArg b;
  byte local_41;
  TCGv_vec pTStack_40;
  uint8_t fixup;
  TCGv_vec t2;
  TCGv_vec t1;
  TCGv_vec v2_local;
  TCGv_vec v1_local;
  TCGv_vec v0_local;
  uint vece_local;
  TCGType_conflict type_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  if (cond - TCG_COND_LT < 0xb || cond == TCG_COND_GTU) {
    switch((long)&switchD_012d8eab::switchdataD_013d0a9c +
           (long)(int)(&switchD_012d8eab::switchdataD_013d0a9c)[cond - TCG_COND_LT]) {
    case 0x12d8ead:
      local_41 = 0;
      bVar2 = false;
      bVar1 = false;
      bVar3 = false;
      break;
    case 0x12d8eb3:
      local_41 = 0;
      bVar2 = false;
      bVar1 = false;
      bVar3 = true;
      break;
    case 0x12d8eb9:
      local_41 = 0;
      bVar2 = true;
      bVar1 = false;
      bVar3 = false;
      break;
    case 0x12d8ebf:
      local_41 = 0;
      bVar2 = true;
      bVar1 = false;
      bVar3 = true;
      break;
    case 0x12d8ec5:
      bVar1 = 2 < vece;
      if (bVar1) {
        local_41 = 0;
      }
      else {
        local_41 = 8;
      }
      bVar2 = false;
      bVar3 = bVar1;
      break;
    case 0x12d8ed7:
      bVar1 = 2 < vece;
      if (bVar1) {
        local_41 = 0;
      }
      else {
        local_41 = 9;
      }
      bVar2 = false;
      bVar3 = !bVar1;
      break;
    case 0x12d8ee9:
      bVar2 = 2 < vece;
      bVar1 = bVar2;
      bVar3 = bVar2;
      if (bVar2) {
        local_41 = 0;
      }
      else {
        local_41 = 0x10;
      }
      break;
    case 0x12d8efb:
      bVar2 = 2 < vece;
      if (bVar2) {
        local_41 = 0;
      }
      else {
        local_41 = 0x11;
      }
      bVar1 = bVar2;
      bVar3 = !bVar2;
      break;
    case 0x12d8f0d:
      goto LAB_012d8f0f;
    }
    if (bVar3) {
      cond = tcg_invert_cond(cond);
    }
    t1 = v2;
    v2_local = v1;
    if (bVar2) {
      cond = tcg_swap_cond(cond);
      t1 = v1;
      v2_local = v2;
    }
    pTStack_40 = (TCGv_vec)0x0;
    t2 = (TCGv_vec)0x0;
    if ((local_41 & 0x18) == 0) {
      if (bVar1) {
        t2 = tcg_temp_new_vec_tricore(tcg_ctx,type);
        pTStack_40 = tcg_temp_new_vec_tricore(tcg_ctx,type);
        tcg_gen_dupi_vec_tricore
                  (tcg_ctx,vece,pTStack_40,1L << ((char)(8 << ((byte)vece & 0x1f)) - 1U & 0x3f));
        tcg_gen_sub_vec_tricore(tcg_ctx,vece,t2,v2_local,pTStack_40);
        tcg_gen_sub_vec_tricore(tcg_ctx,vece,pTStack_40,t1,pTStack_40);
        cond = tcg_signed_cond(cond);
        t1 = pTStack_40;
        v2_local = t2;
      }
    }
    else {
      t2 = tcg_temp_new_vec_tricore(tcg_ctx,type);
      if ((local_41 & 8) == 0) {
        tcg_gen_umax_vec_tricore(tcg_ctx,vece,t2,v2_local,t1);
      }
      else {
        tcg_gen_umin_vec_tricore(tcg_ctx,vece,t2,v2_local,t1);
      }
      cond = TCG_COND_EQ;
      t1 = t2;
    }
    r = tcgv_vec_arg(tcg_ctx,v0);
    a = tcgv_vec_arg(tcg_ctx,v2_local);
    b = tcgv_vec_arg(tcg_ctx,t1);
    vec_gen_4_tricore(tcg_ctx,INDEX_op_cmp_vec,type,vece,r,a,b,(ulong)cond);
    if ((t2 != (TCGv_vec)0x0) && (tcg_temp_free_vec(tcg_ctx,t2), pTStack_40 != (TCGv_vec)0x0)) {
      tcg_temp_free_vec(tcg_ctx,pTStack_40);
    }
    return bVar3;
  }
LAB_012d8f0f:
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
             ,0xdbb,(char *)0x0);
}

Assistant:

static bool expand_vec_cmp_noinv(TCGContext *tcg_ctx, TCGType type, unsigned vece, TCGv_vec v0,
                                 TCGv_vec v1, TCGv_vec v2, TCGCond cond)
{
    enum {
        NEED_INV  = 1,
        NEED_SWAP = 2,
        NEED_BIAS = 4,
        NEED_UMIN = 8,
        NEED_UMAX = 16,
    };
    TCGv_vec t1, t2;
    uint8_t fixup = 0;

    switch (cond) {
    case TCG_COND_EQ:
    case TCG_COND_GT:
        fixup = 0;
        break;
    case TCG_COND_NE:
    case TCG_COND_LE:
        fixup = NEED_INV;
        break;
    case TCG_COND_LT:
        fixup = NEED_SWAP;
        break;
    case TCG_COND_GE:
        fixup = NEED_SWAP | NEED_INV;
        break;
    case TCG_COND_LEU:
        if (vece <= MO_32) {
            fixup = NEED_UMIN;
        } else {
            fixup = NEED_BIAS | NEED_INV;
        }
        break;
    case TCG_COND_GTU:
        if (vece <= MO_32) {
            fixup = NEED_UMIN | NEED_INV;
        } else {
            fixup = NEED_BIAS;
        }
        break;
    case TCG_COND_GEU:
        if (vece <= MO_32) {
            fixup = NEED_UMAX;
        } else {
            fixup = NEED_BIAS | NEED_SWAP | NEED_INV;
        }
        break;
    case TCG_COND_LTU:
        if (vece <= MO_32) {
            fixup = NEED_UMAX | NEED_INV;
        } else {
            fixup = NEED_BIAS | NEED_SWAP;
        }
        break;
    default:
        g_assert_not_reached();
    }

    if (fixup & NEED_INV) {
        cond = tcg_invert_cond(cond);
    }
    if (fixup & NEED_SWAP) {
        t1 = v1, v1 = v2, v2 = t1;
        cond = tcg_swap_cond(cond);
    }

    t1 = t2 = NULL;
    if (fixup & (NEED_UMIN | NEED_UMAX)) {
        t1 = tcg_temp_new_vec(tcg_ctx, type);
        if (fixup & NEED_UMIN) {
            tcg_gen_umin_vec(tcg_ctx, vece, t1, v1, v2);
        } else {
            tcg_gen_umax_vec(tcg_ctx, vece, t1, v1, v2);
        }
        v2 = t1;
        cond = TCG_COND_EQ;
    } else if (fixup & NEED_BIAS) {
        t1 = tcg_temp_new_vec(tcg_ctx, type);
        t2 = tcg_temp_new_vec(tcg_ctx, type);
        tcg_gen_dupi_vec(tcg_ctx, vece, t2, 1ull << ((8 << vece) - 1));
        tcg_gen_sub_vec(tcg_ctx, vece, t1, v1, t2);
        tcg_gen_sub_vec(tcg_ctx, vece, t2, v2, t2);
        v1 = t1;
        v2 = t2;
        cond = tcg_signed_cond(cond);
    }

    tcg_debug_assert(cond == TCG_COND_EQ || cond == TCG_COND_GT);
    /* Expand directly; do not recurse.  */
    vec_gen_4(tcg_ctx, INDEX_op_cmp_vec, type, vece,
              tcgv_vec_arg(tcg_ctx, v0), tcgv_vec_arg(tcg_ctx, v1), tcgv_vec_arg(tcg_ctx, v2), cond);

    if (t1) {
        tcg_temp_free_vec(tcg_ctx, t1);
        if (t2) {
            tcg_temp_free_vec(tcg_ctx, t2);
        }
    }
    return fixup & NEED_INV;
}